

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::CodeHolder::flatten(CodeHolder *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  lVar1 = *(long *)&this->_sectionsByOrder;
  lVar3 = (ulong)*(uint *)&this->field_0xf0 << 3;
  lVar4 = 0;
  uVar8 = 0;
  do {
    if (lVar3 == lVar4) {
      uVar8 = 0;
      lVar4 = 0;
      for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 8) {
        lVar2 = *(long *)(lVar1 + lVar5);
        uVar6 = *(ulong *)(lVar2 + 0x50);
        if (*(ulong *)(lVar2 + 0x50) < *(ulong *)(lVar2 + 0x18)) {
          uVar6 = *(ulong *)(lVar2 + 0x18);
        }
        if (uVar6 != 0) {
          uVar8 = -(ulong)*(uint *)(lVar2 + 8) & (uVar8 + *(uint *)(lVar2 + 8)) - 1;
        }
        *(ulong *)(lVar2 + 0x10) = uVar8;
        if (lVar4 != 0) {
          *(ulong *)(lVar4 + 0x18) = uVar8 - *(long *)(lVar4 + 0x10);
        }
        uVar8 = uVar8 + uVar6;
        lVar4 = lVar2;
      }
      return 0;
    }
    lVar5 = *(long *)(lVar1 + lVar4);
    uVar6 = *(ulong *)(lVar5 + 0x50);
    if (*(ulong *)(lVar5 + 0x50) < *(ulong *)(lVar5 + 0x18)) {
      uVar6 = *(ulong *)(lVar5 + 0x18);
    }
    if (uVar6 != 0) {
      uVar7 = -(ulong)*(uint *)(lVar5 + 8) & (uVar8 + *(uint *)(lVar5 + 8)) - 1;
      if (uVar7 < uVar8) {
        return 9;
      }
      uVar8 = uVar7 + uVar6;
      if (CARRY8(uVar7,uVar6)) {
        return 9;
      }
    }
    lVar4 = lVar4 + 8;
  } while( true );
}

Assistant:

Error CodeHolder::flatten() noexcept {
  uint64_t offset = 0;
  for (Section* section : _sectionsByOrder) {
    uint64_t realSize = section->realSize();
    if (realSize) {
      uint64_t alignedOffset = Support::alignUp(offset, section->alignment());
      if (ASMJIT_UNLIKELY(alignedOffset < offset))
        return DebugUtils::errored(kErrorTooLarge);

      Support::FastUInt8 of = 0;
      offset = Support::addOverflow(alignedOffset, realSize, &of);

      if (ASMJIT_UNLIKELY(of))
        return DebugUtils::errored(kErrorTooLarge);
    }
  }

  // Now we know that we can assign offsets of all sections properly.
  Section* prev = nullptr;
  offset = 0;
  for (Section* section : _sectionsByOrder) {
    uint64_t realSize = section->realSize();
    if (realSize)
      offset = Support::alignUp(offset, section->alignment());
    section->_offset = offset;

    // Make sure the previous section extends a bit to cover the alignment.
    if (prev)
      prev->_virtualSize = offset - prev->_offset;

    prev = section;
    offset += realSize;
  }

  return kErrorOk;
}